

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O3

HTTP_HEADERS_RESULT
headers_ReplaceHeaderNameValuePair(HTTP_HEADERS_HANDLE handle,char *name,char *value,_Bool replace)

{
  char cVar1;
  MAP_RESULT MVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  size_t sVar7;
  HTTP_HEADERS_RESULT HVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  char *__size;
  char *pcVar12;
  
  if ((name == (char *)0x0 || handle == (HTTP_HEADERS_HANDLE)0x0) || value == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_INVALID_ARG;
    }
    pcVar11 = "invalid arg (NULL) , result= %s%s (%d)";
    iVar6 = 0x51;
LAB_001668e7:
    HVar8 = HTTP_HEADERS_INVALID_ARG;
    pcVar12 = (char *)0x2;
    pcVar5 = HTTP_HEADERS_RESULTStringStorage[2];
  }
  else {
    sVar4 = strlen(name);
    if (sVar4 != 0) {
      sVar7 = 0;
      do {
        cVar1 = name[sVar7];
        if (((cVar1 < '!') || (cVar1 == ':')) || (cVar1 == '\x7f')) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return HTTP_HEADERS_INVALID_ARG;
          }
          pcVar11 = "(result = %s%s (%d))";
          iVar6 = 100;
          goto LAB_001668e7;
        }
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    pcVar11 = Map_GetValueFromKey(handle->headers,name);
    while (((ulong)(byte)*value < 0x21 && ((0x100002600U >> ((ulong)(byte)*value & 0x3f) & 1) != 0))
          ) {
      value = (char *)((byte *)value + 1);
    }
    if (!replace && pcVar11 != (char *)0x0) {
      sVar4 = strlen(pcVar11);
      sVar7 = strlen(value);
      uVar9 = sVar4 + 2;
      if (0xfffffffffffffffd < sVar4) {
        uVar9 = 0xffffffffffffffff;
      }
      lVar10 = uVar9 + sVar7;
      if (CARRY8(uVar9,sVar7)) {
        lVar10 = -1;
      }
      __size = (char *)(lVar10 + 1);
      if (__size == (char *)0x0) {
        __size = (char *)0xffffffffffffffff;
      }
      if ((__size != (char *)0xffffffffffffffff) &&
         (pcVar5 = (char *)malloc((size_t)__size), pcVar5 != (char *)0x0)) {
        memcpy(pcVar5,pcVar11,sVar4);
        (pcVar5 + sVar4)[0] = ',';
        (pcVar5 + sVar4)[1] = ' ';
        memcpy(pcVar5 + sVar4 + 2,value,sVar7 + 1);
        MVar2 = Map_AddOrUpdate(handle->headers,name,pcVar5);
        HVar8 = HTTP_HEADERS_OK;
        if (MVar2 != MAP_OK) {
          p_Var3 = xlogging_get_log_function();
          HVar8 = HTTP_HEADERS_ERROR;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpheaders.c"
                      ,"headers_ReplaceHeaderNameValuePair",0x90,1,
                      "failed to Map_AddOrUpdate, result= %s%s (%d)","",
                      HTTP_HEADERS_RESULTStringStorage[5],5);
          }
        }
        free(pcVar5);
        return HVar8;
      }
      p_Var3 = xlogging_get_log_function();
      HVar8 = HTTP_HEADERS_ALLOC_FAILED;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return HTTP_HEADERS_ALLOC_FAILED;
      }
      pcVar11 = "failed to malloc, size= %zu, result= %s%s (%d)";
      iVar6 = 0x7f;
      pcVar5 = "";
      pcVar12 = HTTP_HEADERS_RESULTStringStorage[3];
      goto LAB_001668f7;
    }
    MVar2 = Map_AddOrUpdate(handle->headers,name,value);
    if (MVar2 == MAP_OK) {
      return HTTP_HEADERS_OK;
    }
    p_Var3 = xlogging_get_log_function();
    HVar8 = HTTP_HEADERS_ALLOC_FAILED;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_ALLOC_FAILED;
    }
    pcVar11 = "failed to Map_AddOrUpdate, result= %s%s (%d)";
    iVar6 = 0xa1;
    pcVar12 = (char *)0x3;
    pcVar5 = HTTP_HEADERS_RESULTStringStorage[3];
  }
  __size = "";
LAB_001668f7:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpheaders.c"
            ,"headers_ReplaceHeaderNameValuePair",iVar6,1,pcVar11,__size,pcVar5,pcVar12);
  return HVar8;
}

Assistant:

static HTTP_HEADERS_RESULT headers_ReplaceHeaderNameValuePair(HTTP_HEADERS_HANDLE handle, const char* name, const char* value, bool replace)
{
    HTTP_HEADERS_RESULT result;
    /*Codes_SRS_HTTP_HEADERS_99_014:[ The function shall return when the handle is not valid or when name parameter is NULL or when value parameter is NULL.]*/
    if (
        (handle == NULL) ||
        (name == NULL) ||
        (value == NULL)
        )
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("invalid arg (NULL) , result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_036:[ If name contains the characters outside character codes 33 to 126 then the return value shall be HTTP_HEADERS_INVALID_ARG]*/
        /*Codes_SRS_HTTP_HEADERS_99_031:[ If name contains the character ":" then the return value shall be HTTP_HEADERS_INVALID_ARG.]*/
        size_t i;
        size_t nameLen = strlen(name);
        for (i = 0; i < nameLen; i++)
        {
            if ((name[i] < 33) || (126 < name[i]) || (name[i] == ':'))
            {
                break;
            }
        }

        if (i < nameLen)
        {
            result = HTTP_HEADERS_INVALID_ARG;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)handle;
            const char* existingValue = Map_GetValueFromKey(handleData->headers, name);
            /*eat up the whitespaces from value, as per RFC 2616, chapter 4.2 "The field value MAY be preceded by any amount of LWS, though a single SP is preferred."*/
            /*Codes_SRS_HTTP_HEADERS_02_002: [The LWS from the beginning of the value shall not be stored.] */
            while ((value[0] == ' ') || (value[0] == '\t') || (value[0] == '\r') || (value[0] == '\n'))
            {
                value++;
            }

            if (!replace && (existingValue != NULL))
            {
                char* newValue;
                size_t existingValueLen = strlen(existingValue);
                size_t valueLen = strlen(value);
                size_t malloc_size = safe_add_size_t(existingValueLen, /*COMMA_AND_SPACE_LENGTH*/ 2);
                malloc_size = safe_add_size_t(malloc_size, valueLen);
                malloc_size = safe_add_size_t(malloc_size, /*EOL*/ 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX ||
                    (newValue = (char*)malloc(malloc_size)) == NULL)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                    result = HTTP_HEADERS_ALLOC_FAILED;
                    LogError("failed to malloc, size= %zu, result= %" PRI_MU_ENUM "", malloc_size, MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    char* runNewValue;
                    /*Codes_SRS_HTTP_HEADERS_99_017:[ If the name already exists in the collection of headers, the function shall concatenate the new value after the existing value, separated by a comma and a space as in: old-value+", "+new-value.]*/
                    (void)memcpy(newValue, existingValue, existingValueLen);
                    runNewValue = newValue + existingValueLen;
                    (*runNewValue++) = ',';
                    (*runNewValue++) = ' ';
                    (void)memcpy(runNewValue, value, valueLen + /*EOL*/ 1);

                    /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                    if (Map_AddOrUpdate(handleData->headers, name, newValue) != MAP_OK)
                    {
                        /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                        result = HTTP_HEADERS_ERROR;
                        LogError("failed to Map_AddOrUpdate, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                    }
                    else
                    {
                        /*Codes_SRS_HTTP_HEADERS_99_013:[ The function shall return HTTP_HEADERS_OK when execution is successful.]*/
                        result = HTTP_HEADERS_OK;
                    }
                    free(newValue);
                }
            }
            else
            {
                /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                if (Map_AddOrUpdate(handleData->headers, name, value) != MAP_OK)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_015:[ The function shall return HTTP_HEADERS_ALLOC_FAILED when an internal request to allocate memory fails.]*/
                    result = HTTP_HEADERS_ALLOC_FAILED;
                    LogError("failed to Map_AddOrUpdate, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    result = HTTP_HEADERS_OK;
                }
            }
        }
    }

    return result;
}